

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

void http_entity_reset(nni_http_entity *entity)

{
  http_header *h;
  
  if ((entity->own == true) && (entity->size != 0)) {
    nni_free(entity->data,entity->size);
  }
  while( true ) {
    h = (http_header *)nni_list_first(&entity->hdrs);
    if (h == (http_header *)0x0) break;
    nni_http_free_header(h);
  }
  nni_free(entity->buf,entity->bufsz);
  entity->data = (char *)0x0;
  entity->size = 0;
  entity->buf = (char *)0x0;
  entity->bufsz = 0;
  entity->parsed = false;
  entity->own = false;
  return;
}

Assistant:

static void
http_entity_reset(nni_http_entity *entity)
{
	if (entity->own && entity->size) {
		nni_free(entity->data, entity->size);
	}
	http_headers_reset(&entity->hdrs);
	nni_free(entity->buf, entity->bufsz);
	entity->data   = NULL;
	entity->size   = 0;
	entity->own    = false;
	entity->parsed = false;
	entity->buf    = NULL;
	entity->bufsz  = 0;
}